

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void __thiscall ObjectBlockPool<512,_128>::Mark(ObjectBlockPool<512,_128> *this,uint number)

{
  uint local_38;
  uint local_24;
  MyLargeBlock *pMStack_20;
  uint i;
  MyLargeBlock *curr;
  uint number_local;
  ObjectBlockPool<512,_128> *this_local;
  
  if (number < 2) {
    for (pMStack_20 = this->activePages; pMStack_20 != (MyLargeBlock *)0x0;
        pMStack_20 = pMStack_20->next) {
      local_24 = 0;
      while( true ) {
        if (pMStack_20 == this->activePages) {
          local_38 = this->lastNum;
        }
        else {
          local_38 = 0x80;
        }
        if (local_38 <= local_24) break;
        pMStack_20->page[local_24].marker =
             pMStack_20->page[local_24].marker & (NULLC::OBJECT_VISIBLE ^ 0xffffffffffffffff) |
             (ulong)number;
        local_24 = local_24 + 1;
      }
    }
    return;
  }
  __assert_fail("number <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StdLib.cpp"
                ,0xe6,
                "void ObjectBlockPool<512, 128>::Mark(unsigned int) [elemSize = 512, countInBlock = 128]"
               );
}

Assistant:

void Mark(unsigned int number)
	{
		assert(number <= 1);
		MyLargeBlock *curr = activePages;
		while(curr)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				curr->page[i].marker = (curr->page[i].marker & ~NULLC::OBJECT_VISIBLE) | number;
			}
			curr = curr->next;
		}
	}